

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

string * __thiscall
cmTarget::GetSupportDirectory_abi_cxx11_(string *__return_storage_ptr__,cmTarget *this)

{
  char *pcVar1;
  allocator local_1a;
  undefined1 local_19;
  cmTarget *local_18;
  cmTarget *this_local;
  string *dir;
  
  local_19 = 0;
  local_18 = this;
  this_local = (cmTarget *)__return_storage_ptr__;
  pcVar1 = cmMakefile::GetCurrentBinaryDirectory(this->Makefile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  pcVar1 = cmake::GetCMakeFilesDirectory();
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar1);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&this->Name);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,".dir");
  return __return_storage_ptr__;
}

Assistant:

std::string cmTarget::GetSupportDirectory() const
{
  std::string dir = this->Makefile->GetCurrentBinaryDirectory();
  dir += cmake::GetCMakeFilesDirectory();
  dir += "/";
  dir += this->Name;
#if defined(__VMS)
  dir += "_dir";
#else
  dir += ".dir";
#endif
  return dir;
}